

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.hpp
# Opt level: O0

void __thiscall
gl4cts::SparseTexture2LookupTestCase::FunctionToken::FunctionToken
          (FunctionToken *this,string *fname,string *fargs)

{
  string *fargs_local;
  string *fname_local;
  FunctionToken *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)fname);
  std::__cxx11::string::string((string *)&this->arguments,(string *)fargs);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->allowedTargets);
  return;
}

Assistant:

FunctionToken(std::string fname, std::string fargs) : name(fname), arguments(fargs)
		{
		}